

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadraticCube>::X
          (TPZGeoElRefLess<pzgeom::TPZQuadraticCube> *this,TPZVec<Fad<double>_> *coordinate,
          TPZVec<Fad<double>_> *result)

{
  long *in_RDX;
  TPZFNMatrix<54,_double> cornerco;
  TPZVec<Fad<double>_> *in_stack_00000940;
  TPZVec<Fad<double>_> *in_stack_00000948;
  TPZFMatrix<double> *in_stack_00000950;
  int64_t in_stack_fffffffffffffd90;
  TPZFMatrix<double> *in_stack_fffffffffffffd98;
  TPZGeoElRefLess<pzgeom::TPZQuadraticCube> *in_stack_fffffffffffffda0;
  
  (**(code **)(*in_RDX + 0x18))();
  TPZFNMatrix<54,_double>::TPZFNMatrix
            ((TPZFNMatrix<54,_double> *)in_stack_fffffffffffffda0,(int64_t)in_stack_fffffffffffffd98
             ,in_stack_fffffffffffffd90);
  CornerCoordinates(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  pzgeom::TPZQuadraticCube::X<Fad<double>>(in_stack_00000950,in_stack_00000948,in_stack_00000940);
  TPZFNMatrix<54,_double>::~TPZFNMatrix((TPZFNMatrix<54,_double> *)0x1757ea5);
  return;
}

Assistant:

void
TPZGeoElRefLess<TGeo>::X(TPZVec<Fad<REAL> > &coordinate,TPZVec<Fad<REAL> > &result) const {
    result.Resize(3);
    TPZFNMatrix<54,REAL> cornerco(3,fGeo.NNodes);
    CornerCoordinates(cornerco);
    fGeo.X(cornerco,coordinate,result);
}